

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBase.cpp
# Opt level: O3

void __thiscall DataBase::printInVarMap(DataBase *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  double dVar3;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  p_Var2 = (this->in_var_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var2 != &(this->in_var_map->_M_t)._M_impl.super__Rb_tree_header) {
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
      dVar3 = (double)(**(code **)**(undefined8 **)(p_Var2 + 2))();
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ---  ",7);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &(this->in_var_map->_M_t)._M_impl.super__Rb_tree_header);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void DataBase::printInVarMap() {
  map<string, Variable *>::iterator it;
  cout << endl;
  for (it = this->in_var_map->begin(); it != in_var_map->end(); it++) {
    cout << (*it).first << ": " << (*it).second->calculate() <<
         "  ---  ";
  }
  cout << endl;
}